

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

Command * __thiscall
anon_unknown.dwarf_194fe6::OwnershipAnalysis::includedOwnerOf
          (OwnershipAnalysis *this,StringRef inputPath)

{
  bool bVar1;
  reference ppVar2;
  _Self local_58;
  char *local_50;
  size_t local_48;
  _Base_ptr local_40;
  _Rb_tree_iterator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>
  local_38;
  _Self local_30;
  _Rb_tree_iterator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>
  it;
  OwnershipAnalysis *this_local;
  StringRef inputPath_local;
  
  it._M_node = (_Base_ptr)this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*,_std::less<llbuild::buildsystem::BuildNode_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>_>
       ::begin(&this->includedPaths);
  local_40 = (_Base_ptr)
             std::
             map<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*,_std::less<llbuild::buildsystem::BuildNode_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>_>
             ::end(&this->includedPaths);
  local_50 = inputPath.Data;
  local_48 = inputPath.Length;
  local_30._M_node =
       (_Base_ptr)
       std::
       find_if<std::_Rb_tree_iterator<std::pair<llbuild::buildsystem::BuildNode*const,llbuild::buildsystem::Command*>>,(anonymous_namespace)::OwnershipAnalysis::includedOwnerOf(llvm::StringRef)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>const&)_1_>
                 (local_38,(_Rb_tree_iterator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>
                            )local_40,(anon_class_16_1_7b54c1af_for__M_pred)inputPath);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*,_std::less<llbuild::buildsystem::BuildNode_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>_>
       ::end(&this->includedPaths);
  bVar1 = std::operator!=(&local_30,&local_58);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>
             ::operator*(&local_30);
    inputPath_local.Length = (size_t)ppVar2->second;
  }
  else {
    inputPath_local.Length = 0;
  }
  return (Command *)inputPath_local.Length;
}

Assistant:

Command* includedOwnerOf(StringRef inputPath) {
    auto it = std::find_if(includedPaths.begin(), includedPaths.end(), [inputPath](const std::pair<BuildNode*, Command*>& buildNodeAndCommand) -> bool {
      if (buildNodeAndCommand.first->getName().endswith("/")) {
        return inputPath.startswith(buildNodeAndCommand.first->getName());
      } else {
        return inputPath.startswith(buildNodeAndCommand.first->getName().str() + "/");
      }
    });

    if (it != includedPaths.end()) {
      return (*it).second;
    } else {
      return nullptr;
    }
  }